

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O2

string * __thiscall
t_js_generator::function_signature
          (string *__return_storage_ptr__,t_js_generator *this,t_function *tfunction,string *prefix,
          bool include_callback)

{
  t_js_generator *this_00;
  undefined1 local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_40,prefix,&tfunction->name_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_40," = function(");
  this_00 = (t_js_generator *)local_60;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)&local_40);
  argument_list_abi_cxx11_((string *)local_60,this_00,tfunction->arglist_,include_callback);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::function_signature(t_function* tfunction,
                                          string prefix,
                                          bool include_callback) {

  string str;

  str = prefix + tfunction->get_name() + " = function(";

  str += argument_list(tfunction->get_arglist(), include_callback);

  str += ")";
  return str;
}